

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool __thiscall BasePort::SetProtocol(BasePort *this,ProtocolType prot)

{
  ProtocolType PVar1;
  ostream *poVar2;
  char *pcVar3;
  bool bVar4;
  
  if (prot == PROTOCOL_SEQ_RW) {
    poVar2 = std::operator<<(this->outStr,
                             "BasePort::SetProtocol: system running in NON broadcast mode");
    std::endl<char,std::char_traits<char>>(poVar2);
    this->Protocol_ = PROTOCOL_SEQ_RW;
    PVar1 = PROTOCOL_SEQ_RW;
LAB_0010f16b:
    bVar4 = PVar1 == prot;
  }
  else {
    if (this->IsAllBoardsBroadcastCapable_ == false) {
      poVar2 = std::operator<<(this->outStr,"BasePort::SetProtocol");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      pcVar3 = "***Error: not all boards support broadcasting, ";
    }
    else {
      if (((this->IsAllBoardsRev4_6_ != false) || (this->IsAllBoardsRev7_ != false)) ||
         (this->IsAllBoardsRev8_9_ != false)) {
        poVar2 = this->outStr;
        if (prot == PROTOCOL_SEQ_R_BC_W) {
          poVar2 = std::operator<<(poVar2,
                                   "BasePort::SetProtocol: system running with broadcast write");
          std::endl<char,std::char_traits<char>>(poVar2);
          this->Protocol_ = PROTOCOL_SEQ_R_BC_W;
          PVar1 = PROTOCOL_SEQ_R_BC_W;
        }
        else if (prot == PROTOCOL_BC_QRW) {
          poVar2 = std::operator<<(poVar2,
                                   "BasePort::SetProtocol: system running with broadcast query, read, and write"
                                  );
          std::endl<char,std::char_traits<char>>(poVar2);
          this->Protocol_ = PROTOCOL_BC_QRW;
          PVar1 = PROTOCOL_BC_QRW;
        }
        else {
          poVar2 = std::operator<<(poVar2,
                                   "BasePort::SetProtocol: warning: unknown protocol (ignored): ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,prot);
          std::endl<char,std::char_traits<char>>(poVar2);
          PVar1 = this->Protocol_;
        }
        goto LAB_0010f16b;
      }
      poVar2 = std::operator<<(this->outStr,"BasePort::SetProtocol");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      pcVar3 = "***Error: cannot use broadcast mode with this mix of firmware, ";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"          please upgrade your firmware");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool BasePort::SetProtocol(ProtocolType prot) {
    if (prot != BasePort::PROTOCOL_SEQ_RW) {
        if (!IsAllBoardsBroadcastCapable_) {
            outStr << "BasePort::SetProtocol" << std::endl
                   << "***Error: not all boards support broadcasting, " << std::endl
                   << "          please upgrade your firmware"  << std::endl;
            return false;
        }
        if (!IsBroadcastFirmwareMixValid()) {
            outStr << "BasePort::SetProtocol" << std::endl
                   << "***Error: cannot use broadcast mode with this mix of firmware, " << std::endl
                   << "          please upgrade your firmware" << std::endl;
            return false;
        }
    }
    switch (prot) {
        case BasePort::PROTOCOL_SEQ_RW:
            outStr << "BasePort::SetProtocol: system running in NON broadcast mode" << std::endl;
            Protocol_ = prot;
            break;
        case BasePort::PROTOCOL_SEQ_R_BC_W:
            outStr << "BasePort::SetProtocol: system running with broadcast write" << std::endl;
            Protocol_ = prot;
            break;
        case BasePort::PROTOCOL_BC_QRW:
            outStr << "BasePort::SetProtocol: system running with broadcast query, read, and write" << std::endl;
            Protocol_ = prot;
            break;
        default:
            outStr << "BasePort::SetProtocol: warning: unknown protocol (ignored): " << prot << std::endl;
            break;
    }
    return (Protocol_ == prot);
}